

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::validInverseSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int *newSol1,int *newSol2,int *worseSol)

{
  double dVar1;
  Scalar *pSVar2;
  reference pFVar3;
  reference piVar4;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  Scal SVar5;
  Scal SVar6;
  ReturnType RVar7;
  double dVar8;
  Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0> PVar9;
  int j_2;
  int j_1;
  Z aux;
  Scal dMax;
  Scal dist;
  Scal dof;
  int k;
  Scal p_value;
  Scal max_p_value;
  int j;
  Vec sumWsq;
  Vec T;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffb88;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffb90;
  Scalar *in_stack_fffffffffffffb98;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffba0;
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *in_stack_fffffffffffffba8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  *in_stack_fffffffffffffbb0;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
  *in_stack_fffffffffffffbb8;
  StorageBaseType *in_stack_fffffffffffffbd0;
  RhsNested in_stack_fffffffffffffbd8;
  int local_23c;
  int local_10c;
  double local_100;
  int local_9c;
  double local_90;
  int local_88;
  bool local_1;
  
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffb98);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb90,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffb88);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffb98);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb90,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffb88);
  for (local_88 = 0; local_88 < *(int *)(in_RDI + 0xb0); local_88 = local_88 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
    dVar8 = *pSVar2;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260),(long)local_88);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
    *pSVar2 = *pSVar2 + dVar8;
    pFVar3 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_88);
    SVar5 = LinearExpert<1,_1>::get_p_x(&pFVar3->super_LinearExpert<1,_1>);
    pFVar3 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_88);
    SVar6 = LinearExpert<1,_1>::get_p_x(&pFVar3->super_LinearExpert<1,_1>);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260),(long)local_88);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
    *pSVar2 = SVar5 * SVar6 + *pSVar2;
  }
  *in_RCX = -1;
  local_90 = -1.0;
  for (local_9c = 0; local_9c < *(int *)(in_RDI + 0x328); local_9c = local_9c + 1) {
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  *)(in_RDI + 0x2e0),(long)local_9c);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffba0,(Index)in_stack_fffffffffffffb98);
    RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
            dot<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                       in_stack_fffffffffffffb90,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                        *)in_stack_fffffffffffffb88);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
    *pSVar2 = *pSVar2 - RVar7;
    dVar8 = *(double *)(in_RDI + 0x188);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
    *pSVar2 = *pSVar2 / dVar8;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
    dVar8 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
    dVar1 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
    if ((1.0 <= ((dVar8 * dVar1) / *pSVar2 - 1.0) * 1.0 + 1.0) &&
       (pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88),
       0.0 < *pSVar2)) {
      boost::math::
      chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::chi_squared_distribution
                ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                  *)in_stack_fffffffffffffba0,(double)in_stack_fffffffffffffb98);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
      dVar8 = boost::math::
              cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        (in_stack_fffffffffffffba8,(double *)in_stack_fffffffffffffba0);
      if (local_90 <= dVar8) {
        *in_RCX = local_9c;
        local_90 = dVar8;
      }
    }
  }
  if (*(double *)(in_RDI + 0x60) < local_90) {
    local_100 = -1.0;
    Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x284989);
    for (local_10c = 0; local_10c < *(int *)(in_RDI + 0xb0); local_10c = local_10c + 1) {
      piVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260),(long)local_10c);
      if (*piVar4 == *in_RCX) {
        in_stack_fffffffffffffbd0 =
             (StorageBaseType *)
             std::
             vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                           *)(in_RDI + 0x278),(long)local_10c);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x2e0),(long)*in_RCX);
        PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                           in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        in_stack_fffffffffffffbd8 = PVar9.m_rhs;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (in_stack_fffffffffffffba0,(Index)in_stack_fffffffffffffb98);
        Eigen::operator*((double *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Matrix<double,1,1,0,1,1>,0>>
        ::operator-(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        Eigen::Matrix<double,1,1,0,1,1>::operator=
                  ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffb90,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                    *)in_stack_fffffffffffffb88);
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
        in_stack_fffffffffffffbb8 =
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
              *)*pSVar2;
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x2e0),(long)*in_RCX);
        RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
                dot<Eigen::Matrix<double,1,1,0,1,1>>
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                           in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        if (local_100 < (double)in_stack_fffffffffffffbb8 + RVar7) {
          *in_RSI = local_10c;
          local_100 = (double)in_stack_fffffffffffffbb8 + RVar7;
        }
      }
    }
    local_100 = -1.0;
    for (local_23c = 0; local_23c < *(int *)(in_RDI + 0xb0); local_23c = local_23c + 1) {
      piVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260),(long)local_23c);
      if (*piVar4 == *in_RCX) {
        this_00 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                  std::
                  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                *)(in_RDI + 0x278),(long)local_23c);
        pFVar3 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)(in_RDI + 0x98),(long)*in_RSI);
        LinearExpert<1,_1>::getPredZ(&pFVar3->super_LinearExpert<1,_1>);
        PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                           in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (this_00,(Index)in_stack_fffffffffffffb98);
        Eigen::operator*((double *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Matrix<double,1,1,0,1,1>,0>>
        ::operator-(in_stack_fffffffffffffbb8,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                     *)PVar9.m_lhs);
        Eigen::Matrix<double,1,1,0,1,1>::operator=
                  ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffb90,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                    *)in_stack_fffffffffffffb88);
        in_stack_fffffffffffffb98 =
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
        in_stack_fffffffffffffb88 =
             (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)*in_stack_fffffffffffffb98;
        pFVar3 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)(in_RDI + 0x98),(long)*in_RSI);
        LinearExpert<1,_1>::getPredZ(&pFVar3->super_LinearExpert<1,_1>);
        in_stack_fffffffffffffb90 =
             (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
             Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
             dot<Eigen::Matrix<double,1,1,0,1,1>>
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                        in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        if (local_100 < (double)in_stack_fffffffffffffb88 + (double)in_stack_fffffffffffffb90) {
          *in_RDX = local_23c;
          local_100 = (double)in_stack_fffffffffffffb88 + (double)in_stack_fffffffffffffb90;
        }
      }
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x284e16);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x284e25);
  return local_1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validInverseSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    Vec T = Vec::Zero(nInvSolFound);
    Vec sumWsq = Vec::Zero(nInvSolFound);
    for(int j = 0; j < M; j++)
    {
        T(sNearestInv[j]) += zInvRzj(j);
        sumWsq(sNearestInv[j]) += experts[j].get_p_x()*experts[j].get_p_x();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;
    for(int k = 0; k < nInvSolFound; k++)
    {
        T(k) -= invPredictions[k].dot( sumInvRzj.col(k) );
        T(k) /= (sumAll);

        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k) - 1.0) * d;
//        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k)) * d;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dist, dMax = -1.0;
        Z aux;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * invPredictions[worseSol] - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + invPredictions[worseSol].dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol1 = j;
            }
        }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * experts[newSol1].getPredZ() - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + experts[newSol1].getPredZ().dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol2 = j;
            }
        }

        return false;
    }
}